

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastPop
          (Lowerer *this,Opnd *baseOpndParam,Instr *callInstr,LabelInstr *labelHelper,
          LabelInstr *doneLabel,LabelInstr *bailOutLabelHelper)

{
  code *pcVar1;
  undefined8 dst;
  bool bVar2;
  IRType IVar3;
  uint32 offset;
  undefined4 *puVar4;
  ArrayRegOpnd *this_00;
  StackSym *pSVar5;
  StackSym *this_01;
  IndirOpnd *src;
  IntConstOpnd *pIVar6;
  RegOpnd *this_02;
  IndirOpnd *pIVar7;
  IndirOpnd *indirOpnd;
  bool isStringIndex;
  bool isTypedArrayElement;
  IndirOpnd *pIStack_e8;
  IndirOpnd *arrayRef;
  RegOpnd *mutableArrayLengthOpnd;
  AutoReuseOpnd autoReuseMutableArrayLengthOpnd;
  AutoReuseOpnd autoReuseArrayOpnd;
  ArrayRegOpnd *arrayRegOpnd;
  undefined1 local_98 [8];
  AutoReuseOpnd autoReuseArrayLengthOpnd;
  RegOpnd *arrayLengthOpnd;
  RegOpnd *arrayOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a;
  undefined1 local_58 [6];
  ValueType arrValueType;
  AutoReuseOpnd autoReuseBaseOpnd;
  RegOpnd *baseOpnd;
  LabelInstr *bailOutLabelHelper_local;
  LabelInstr *doneLabel_local;
  LabelInstr *labelHelper_local;
  Instr *callInstr_local;
  Opnd *baseOpndParam_local;
  Lowerer *this_local;
  
  bVar2 = ShouldGenerateArrayFastPath(this,baseOpndParam,false,false,false);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5320,"(ShouldGenerateArrayFastPath(baseOpndParam, false, false, false))",
                       "ShouldGenerateArrayFastPath(baseOpndParam, false, false, false)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  arrayLengthOpnd = IR::Opnd::AsRegOpnd(baseOpndParam);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_58,&arrayLengthOpnd->super_Opnd,this->m_func,true);
  local_5a.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(baseOpndParam);
  autoReuseArrayLengthOpnd.autoDelete = false;
  autoReuseArrayLengthOpnd.wasInUse = false;
  autoReuseArrayLengthOpnd._18_6_ = 0;
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_98);
  bVar2 = ValueType::IsAnyOptimizedArray((ValueType *)&local_5a.field_0);
  if (bVar2) {
    bVar2 = IR::RegOpnd::IsArrayRegOpnd(arrayLengthOpnd);
    if (bVar2) {
      this_00 = IR::RegOpnd::AsArrayRegOpnd(arrayLengthOpnd);
      pSVar5 = IR::ArrayRegOpnd::LengthSym(this_00);
      if (pSVar5 != (StackSym *)0x0) {
        pSVar5 = IR::ArrayRegOpnd::LengthSym(this_00);
        this_01 = IR::ArrayRegOpnd::LengthSym(this_00);
        IVar3 = StackSym::GetType(this_01);
        autoReuseArrayLengthOpnd._16_8_ = IR::RegOpnd::New(pSVar5,IVar3,this->m_func);
        IR::RegOpnd::FreezeSymValue((RegOpnd *)autoReuseArrayLengthOpnd._16_8_);
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)local_98,(Opnd *)autoReuseArrayLengthOpnd._16_8_,this->m_func,
                   true);
      }
    }
  }
  else {
    arrayLengthOpnd =
         GenerateArrayTest(this,arrayLengthOpnd,bailOutLabelHelper,bailOutLabelHelper,callInstr,
                           false,true,false);
    arrayRegOpnd._2_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&arrayLengthOpnd->super_Opnd);
    arrayRegOpnd._4_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToDefiniteObject((ValueType *)((long)&arrayRegOpnd + 2));
    arrayRegOpnd._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)((long)&arrayRegOpnd + 4),false);
    local_5a.field_0 = arrayRegOpnd._6_2_;
  }
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseMutableArrayLengthOpnd.autoDelete,
             &arrayLengthOpnd->super_Opnd,this->m_func,true);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&mutableArrayLengthOpnd);
  arrayRef = (IndirOpnd *)IR::RegOpnd::New(TyUint32,this->m_func);
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&mutableArrayLengthOpnd,(Opnd *)arrayRef,this->m_func,true);
  pIVar7 = arrayRef;
  if (autoReuseArrayLengthOpnd._16_8_ == 0) {
    offset = Js::ArrayObject::GetOffsetOfLength();
    IVar3 = IR::Opnd::GetType(&arrayRef->super_Opnd);
    src = IR::IndirOpnd::New(arrayLengthOpnd,offset,IVar3,this->m_func,false);
    InsertMove(&pIVar7->super_Opnd,&src->super_Opnd,callInstr,true);
  }
  else {
    InsertMove(&arrayRef->super_Opnd,(Opnd *)autoReuseArrayLengthOpnd._16_8_,callInstr,true);
  }
  pIVar7 = arrayRef;
  autoReuseArrayLengthOpnd._16_8_ = arrayRef;
  pIVar6 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
  InsertCompareBranch(this,&pIVar7->super_Opnd,&pIVar6->super_Opnd,BrEq_A,true,bailOutLabelHelper,
                      callInstr,false);
  dst = autoReuseArrayLengthOpnd._16_8_;
  pIVar6 = IR::IntConstOpnd::New(1,TyUint32,this->m_func,false);
  InsertSub(false,(Opnd *)dst,(Opnd *)dst,&pIVar6->super_Opnd,callInstr);
  pIStack_e8 = IR::IndirOpnd::New(arrayLengthOpnd,(RegOpnd *)autoReuseArrayLengthOpnd._16_8_,TyVar,
                                  this->m_func);
  this_02 = IR::IndirOpnd::GetBaseOpnd(pIStack_e8);
  indirOpnd._6_2_ = local_5a.field_0;
  IR::Opnd::SetValueType(&this_02->super_Opnd,(ValueType)local_5a.field_0);
  pIVar7 = GenerateFastElemICommon
                     (this,callInstr,false,pIStack_e8,labelHelper,labelHelper,(LabelInstr *)0x0,
                      (bool *)((long)&indirOpnd + 5),(bool *)((long)&indirOpnd + 4),(bool *)0x0,
                      (Opnd **)0x0,(LabelInstr **)0x0,true,true,false,bailOutLabelHelper,(bool *)0x0
                      ,FldInfo_NoInfo);
  if ((indirOpnd._5_1_ & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5372,"(!isTypedArrayElement)","!isTypedArrayElement");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (pIVar7 == (IndirOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5373,"(indirOpnd)","indirOpnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&mutableArrayLengthOpnd);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseMutableArrayLengthOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_98);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_58);
  return true;
}

Assistant:

bool Lowerer::GenerateFastPop(IR::Opnd *baseOpndParam, IR::Instr *callInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel, IR::LabelInstr * bailOutLabelHelper)
{
    Assert(ShouldGenerateArrayFastPath(baseOpndParam, false, false, false));

    //     TEST baseOpnd, AtomTag                  -- check baseOpnd not tagged int
    //     JNE $helper
    //     CMP [baseOpnd], JavascriptArray::`vtable' -- check baseOpnd isArray
    //     JNE $helper
    //     MOV r2, [baseOpnd + offset(length)]     -- Load array length

    IR::RegOpnd *       baseOpnd = baseOpndParam->AsRegOpnd();
    const IR::AutoReuseOpnd autoReuseBaseOpnd(baseOpnd, m_func);

    ValueType arrValueType(baseOpndParam->GetValueType());
    IR::RegOpnd *arrayOpnd = baseOpnd;
    IR::RegOpnd *arrayLengthOpnd = nullptr;
    IR::AutoReuseOpnd autoReuseArrayLengthOpnd;
    if(!arrValueType.IsAnyOptimizedArray())
    {
        arrayOpnd = GenerateArrayTest(baseOpnd, bailOutLabelHelper, bailOutLabelHelper, callInstr, false, true);
        arrValueType = arrayOpnd->GetValueType().ToDefiniteObject().SetHasNoMissingValues(false);
    }
    else if(arrayOpnd->IsArrayRegOpnd())
    {
        IR::ArrayRegOpnd *const arrayRegOpnd = arrayOpnd->AsArrayRegOpnd();
        if(arrayRegOpnd->LengthSym())
        {
            arrayLengthOpnd = IR::RegOpnd::New(arrayRegOpnd->LengthSym(), arrayRegOpnd->LengthSym()->GetType(), m_func);
            DebugOnly(arrayLengthOpnd->FreezeSymValue());
            autoReuseArrayLengthOpnd.Initialize(arrayLengthOpnd, m_func);
        }
    }
    const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, m_func);

    IR::AutoReuseOpnd autoReuseMutableArrayLengthOpnd;
    {
        IR::RegOpnd *const mutableArrayLengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
        autoReuseMutableArrayLengthOpnd.Initialize(mutableArrayLengthOpnd, m_func);
        if(arrayLengthOpnd)
        {
            // mov mutableArrayLength, arrayLength
            InsertMove(mutableArrayLengthOpnd, arrayLengthOpnd, callInstr);
        }
        else
        {
            // MOV mutableArrayLength, [array + offset(length)]     -- Load array length
            // We know this index is safe since, so mark it as UInt32 to avoid unnecessary conversion/checks
            InsertMove(
                mutableArrayLengthOpnd,
                IR::IndirOpnd::New(
                    arrayOpnd,
                    Js::JavascriptArray::GetOffsetOfLength(),
                    mutableArrayLengthOpnd->GetType(),
                    this->m_func),
                callInstr);
        }
        arrayLengthOpnd = mutableArrayLengthOpnd;
    }

    InsertCompareBranch(arrayLengthOpnd, IR::IntConstOpnd::New(0, TyUint32, this->m_func), Js::OpCode::BrEq_A, true, bailOutLabelHelper, callInstr);
    InsertSub(false, arrayLengthOpnd, arrayLengthOpnd, IR::IntConstOpnd::New(1, TyUint32, this->m_func),callInstr);

    IR::IndirOpnd *arrayRef = IR::IndirOpnd::New(arrayOpnd, arrayLengthOpnd, TyVar, this->m_func);
    arrayRef->GetBaseOpnd()->SetValueType(arrValueType);

    //Array length is going to overflow, hence don't check for Array.length and Segment.length overflow.
    bool isTypedArrayElement, isStringIndex;
    IR::IndirOpnd *const indirOpnd =
        GenerateFastElemICommon(
            callInstr,
            false,
            arrayRef,
            labelHelper,
            labelHelper,
            nullptr,
            &isTypedArrayElement,
            &isStringIndex,
            nullptr,
            nullptr,
            nullptr /*pLabelSegmentLengthIncreased*/,
            true /*checkArrayLengthOverflow*/,
            true /* forceGenerateFastPath */,
            false/* = returnLength */,
            bailOutLabelHelper /* = bailOutLabelInstr*/);
    Assert(!isTypedArrayElement);
    Assert(indirOpnd);
    return true;
}